

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O1

void __thiscall SQASTWritingVisitor::writeNodeHeader(SQASTWritingVisitor *this,Node *n)

{
  OutputStream *pOVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  pOVar1 = this->stream;
  uVar3 = (long)(int)n->_op + 1;
  uVar4 = uVar3;
  if (0x7f < (uint)uVar3) {
    do {
      (**pOVar1->_vptr_OutputStream)(pOVar1,(ulong)(byte)((byte)uVar3 | 0x80));
      uVar4 = uVar3 >> 7;
      bVar2 = 0x3fff < uVar3;
      uVar3 = uVar4;
    } while (bVar2);
  }
  (**pOVar1->_vptr_OutputStream)(pOVar1,uVar4 & 0xff);
  pOVar1 = this->stream;
  uVar4 = (ulong)(n->_coordinates).lineStart;
  uVar3 = uVar4;
  if (0x7f < uVar4) {
    do {
      (**pOVar1->_vptr_OutputStream)(pOVar1,(ulong)(byte)((byte)uVar3 | 0x80));
      uVar4 = uVar3 >> 7;
      bVar2 = 0x3fff < uVar3;
      uVar3 = uVar4;
    } while (bVar2);
  }
  (**pOVar1->_vptr_OutputStream)(pOVar1,uVar4 & 0xff);
  pOVar1 = this->stream;
  uVar4 = (ulong)(n->_coordinates).columnStart;
  uVar3 = uVar4;
  if (0x7f < uVar4) {
    do {
      (**pOVar1->_vptr_OutputStream)(pOVar1,(ulong)(byte)((byte)uVar3 | 0x80));
      uVar4 = uVar3 >> 7;
      bVar2 = 0x3fff < uVar3;
      uVar3 = uVar4;
    } while (bVar2);
  }
  (**pOVar1->_vptr_OutputStream)(pOVar1,uVar4 & 0xff);
  pOVar1 = this->stream;
  uVar4 = (ulong)(n->_coordinates).lineEnd;
  uVar3 = uVar4;
  if (0x7f < uVar4) {
    do {
      (**pOVar1->_vptr_OutputStream)(pOVar1,(ulong)(byte)((byte)uVar3 | 0x80));
      uVar4 = uVar3 >> 7;
      bVar2 = 0x3fff < uVar3;
      uVar3 = uVar4;
    } while (bVar2);
  }
  (**pOVar1->_vptr_OutputStream)(pOVar1,uVar4 & 0xff);
  pOVar1 = this->stream;
  uVar4 = (ulong)(n->_coordinates).columnEnd;
  uVar3 = uVar4;
  if (0x7f < uVar4) {
    do {
      (**pOVar1->_vptr_OutputStream)(pOVar1,(ulong)(byte)((byte)uVar3 | 0x80));
      uVar4 = uVar3 >> 7;
      bVar2 = 0x3fff < uVar3;
      uVar3 = uVar4;
    } while (bVar2);
  }
  (**pOVar1->_vptr_OutputStream)(pOVar1,uVar4 & 0xff);
  return;
}

Assistant:

void SQASTWritingVisitor::writeNodeHeader(const Node *n) {
  stream->writeInt32(n->op() + OP_DELTA);

  stream->writeInt32(n->lineStart());
  stream->writeInt32(n->columnStart());
  stream->writeInt32(n->lineEnd());
  stream->writeInt32(n->columnEnd());
}